

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void __thiscall
flatbuffers::php::PhpGenerator::GenTableBuilders
          (PhpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  size_t offset;
  pointer ppFVar6;
  pointer ppFVar7;
  FieldDef *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_90;
  StructDef *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  PhpGenerator *local_40;
  FieldDef *local_38;
  
  local_40 = this;
  GetStartOfTable(struct_def,code_ptr);
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_70 = struct_def;
  if (ppFVar6 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_90.field_2;
    ppFVar7 = ppFVar6;
    local_48 = code_ptr;
    do {
      field = *ppFVar6;
      if (field->deprecated == false) {
        offset = (long)ppFVar7 -
                 (long)(local_70->fields).vec.
                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        if ((field->value).type.base_type == BASE_TYPE_UNION) {
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
          std::__cxx11::string::append((char *)&local_90);
          psVar3 = local_48;
          std::__cxx11::string::_M_append((char *)local_48,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          ConvertCase(&local_90,(string *)field,kUpperCamel,kSnake);
          std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_90._M_dataplus._M_p);
          local_38 = field;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)psVar3);
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
          std::__cxx11::string::append((char *)&local_90);
          std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &Indent_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &Indent_abi_cxx11_);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
          psVar5 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_90.field_2._M_allocated_capacity = *psVar5;
            local_90.field_2._8_8_ = plVar4[3];
            local_90._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar5;
            local_90._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_90._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          NumToString<long>(&local_68,offset);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
          field = local_38;
          psVar5 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_90.field_2._M_allocated_capacity = *psVar5;
            local_90.field_2._8_8_ = plVar4[3];
            local_90._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar5;
            local_90._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_90._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
          std::__cxx11::string::append((char *)&local_90);
          code_ptr = local_48;
          std::__cxx11::string::_M_append((char *)local_48,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          BuildFieldOfTable(field,offset,code_ptr);
        }
        BVar2 = (field->value).type.base_type;
        if ((BVar2 == BASE_TYPE_VECTOR64) || (BVar2 == BASE_TYPE_VECTOR)) {
          BuildVectorOfTable(field,code_ptr);
        }
      }
      ppFVar6 = ppFVar6 + 1;
      ppFVar7 = ppFVar7 + 1;
    } while (ppFVar6 !=
             (local_70->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  GetEndOffsetOnTable(local_40,local_70,code_ptr);
  return;
}

Assistant:

void GenTableBuilders(const StructDef &struct_def, std::string *code_ptr) {
    GetStartOfTable(struct_def, code_ptr);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      auto offset = it - struct_def.fields.vec.begin();
      if (field.value.type.base_type == BASE_TYPE_UNION) {
        std::string &code = *code_ptr;
        code += Indent + "public static function add";
        code += ConvertCase(field.name, Case::kUpperCamel);
        code += "(FlatBufferBuilder $builder, $offset)\n";
        code += Indent + "{\n";
        code += Indent + Indent + "$builder->addOffsetX(";
        code += NumToString(offset) + ", $offset, 0);\n";
        code += Indent + "}\n\n";
      } else {
        BuildFieldOfTable(field, offset, code_ptr);
      }
      if (IsVector(field.value.type)) { BuildVectorOfTable(field, code_ptr); }
    }

    GetEndOffsetOnTable(struct_def, code_ptr);
  }